

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

sunrealtype LBasisD(ARKInterp I,int j,sunrealtype t)

{
  sunrealtype q;
  sunrealtype p;
  int k;
  int i;
  sunrealtype t_local;
  int j_local;
  ARKInterp I_local;
  
  p = 0.0;
  for (i = 0; i < *(int *)((long)I->content + 0x18); i = i + 1) {
    if (i != j) {
      q = 1.0;
      for (k = 0; k < *(int *)((long)I->content + 0x18); k = k + 1) {
        if ((k != j) && (k != i)) {
          q = ((t - *(double *)(*(long *)((long)I->content + 0x10) + (long)k * 8)) /
              (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
              *(double *)(*(long *)((long)I->content + 0x10) + (long)k * 8))) * q;
        }
      }
      p = q / (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
              *(double *)(*(long *)((long)I->content + 0x10) + (long)i * 8)) + p;
    }
  }
  return p;
}

Assistant:

sunrealtype LBasisD(ARKInterp I, int j, sunrealtype t)
{
  int i, k;
  sunrealtype p, q;
  p = ZERO;
  for (i = 0; i < LINT_NHIST(I); i++)
  {
    if (i == j) { continue; }
    q = ONE;
    for (k = 0; k < LINT_NHIST(I); k++)
    {
      if (k == j) { continue; }
      if (k == i) { continue; }
      q *= (t - LINT_TJ(I, k)) / (LINT_TJ(I, j) - LINT_TJ(I, k));
    }
    p += q / (LINT_TJ(I, j) - LINT_TJ(I, i));
  }

  return (p);
}